

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# freelist.h
# Opt level: O1

void __thiscall MeCab::ChunkFreeList<char>::~ChunkFreeList(ChunkFreeList<char> *this)

{
  ~ChunkFreeList(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~ChunkFreeList() {
    for (li_ = 0; li_ < freelist_.size(); li_++)
      delete [] freelist_[li_].second;
  }